

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall
kj::(anonymous_namespace)::PromisedAsyncIoStream::whenWriteDisconnected(PromisedAsyncIoStream *this)

{
  anon_unknown_123::PromisedAsyncIoStream::whenWriteDisconnected((PromisedAsyncIoStream *)this);
  return;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(s, stream) {
      return s->whenWriteDisconnected();
    } else {
      return promise.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(stream)->whenWriteDisconnected();
      }, [](kj::Exception&& e) -> kj::Promise<void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return kj::READY_NOW;
        } else {
          return kj::mv(e);
        }
      });
    }
  }